

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O3

size_t __thiscall
DisconnectedBlockTransactions::DynamicMemoryUsage(DisconnectedBlockTransactions *this)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  uVar1 = (this->iters_by_txid)._M_h._M_bucket_count;
  uVar2 = uVar1 * 8 + 0x1f & 0xfffffffffffffff0;
  if ((uVar1 & 0x1fffffffffffffff) == 0) {
    uVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (this->iters_by_txid)._M_h._M_element_count * 0x40 + this->cachedInnerUsage +
           (this->queuedTx).
           super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl._M_node._M_size * 0x30 + uVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t DisconnectedBlockTransactions::DynamicMemoryUsage() const
{
    return cachedInnerUsage + memusage::DynamicUsage(iters_by_txid) + memusage::DynamicUsage(queuedTx);
}